

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_optimizer.cpp
# Opt level: O0

long _computeIntegerOperation<long,signed_char>(TokenType type,char x,char y)

{
  allocator<char> local_39;
  string local_38;
  char local_14;
  char local_13;
  TokenType local_12;
  char y_local;
  char x_local;
  long lStack_10;
  TokenType type_local;
  
  switch(type) {
  case TOK_OP_ADD:
    lStack_10 = (long)((int)x + (int)y);
    break;
  case TOK_OP_SUB:
    lStack_10 = (long)((int)x - (int)y);
    break;
  case TOK_OP_MOD:
    lStack_10 = (long)((int)x % (int)y);
    break;
  case TOK_OP_MUL:
    lStack_10 = (long)((int)x * (int)y);
    break;
  case TOK_OP_DIV:
    lStack_10 = (long)((int)x / (int)y);
    break;
  default:
    local_14 = y;
    local_13 = x;
    local_12 = type;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Unknown operation",&local_39);
    pfederc::fatal("/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_syntax/src/syntax_optimizer.cpp"
                   ,0x9e,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
    lStack_10 = 0;
  }
  return lStack_10;
}

Assistant:

static R _computeIntegerOperation(TokenType type, T x, T y) noexcept {
	switch (type) {
	case TokenType::TOK_OP_ADD:
		return static_cast<R>(x + y);
  case TokenType::TOK_OP_SUB:
		return static_cast<R>(x - y);
  case TokenType::TOK_OP_MUL:
		return static_cast<R>(x * y);
  case TokenType::TOK_OP_DIV:
		return static_cast<R>(x / y);
  case TokenType::TOK_OP_MOD:
		return static_cast<R>(x % y);
	default:
		fatal(__FILE__, __LINE__, "Unknown operation");
		return 0;
	}
}